

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

Norm2AllModes * icu_63::Norm2AllModes::getNFCInstance(UErrorCode *errorCode)

{
  UBool UVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (Norm2AllModes *)0x0;
  }
  if ((nfcInitOnce != 2) && (UVar1 = umtx_initImplPreInit((UInitOnce *)&nfcInitOnce), UVar1 != '\0')
     ) {
    nfcSingleton = createNFCInstance(errorCode);
    ucln_common_registerCleanup_63(UCLN_COMMON_NORMALIZER2,uprv_normalizer2_cleanup);
    DAT_003ecdac = *errorCode;
    umtx_initImplPostInit((UInitOnce *)&nfcInitOnce);
    return nfcSingleton;
  }
  if (U_ZERO_ERROR < DAT_003ecdac) {
    *errorCode = DAT_003ecdac;
  }
  return nfcSingleton;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }